

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomLayoutItem::read(DomLayoutItem *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomWidget *this_00;
  DomLayout *this_01;
  DomSpacer *this_02;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_03;
  long lVar4;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar5;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_03 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  pQVar5 = local_50.ptr;
  for (lVar4 = 0; local_50.size * 0x68 != lVar4; lVar4 = lVar4 + 0x68) {
    local_68.m_data = *(storage_type_conflict **)(pQVar5 + 8);
    local_68.m_size = *(qsizetype *)(pQVar5 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"row",3);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_80.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
      local_80.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
      iVar2 = QStringView::toInt((QStringView *)&local_80,(bool *)0x0,10);
      this->m_attr_row = iVar2;
      this->m_has_attr_row = true;
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"column",6);
      local_98.a.m_size = local_80.size;
      local_98.a.m_data = (char *)local_80.ptr;
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (bVar1) {
        local_80.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        iVar2 = QStringView::toInt((QStringView *)&local_80,(bool *)0x0,10);
        this->m_attr_column = iVar2;
        this->m_has_attr_column = true;
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"rowspan",7);
        local_98.a.m_size = local_80.size;
        local_98.a.m_data = (char *)local_80.ptr;
        bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        if (bVar1) {
          local_80.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
          local_80.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
          iVar2 = QStringView::toInt((QStringView *)&local_80,(bool *)0x0,10);
          this->m_attr_rowSpan = iVar2;
          this->m_has_attr_rowSpan = true;
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"colspan",7);
          local_98.a.m_size = local_80.size;
          local_98.a.m_data = (char *)local_80.ptr;
          bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          if (bVar1) {
            local_80.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
            local_80.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
            iVar2 = QStringView::toInt((QStringView *)&local_80,(bool *)0x0,10);
            this->m_attr_colSpan = iVar2;
            this->m_has_attr_colSpan = true;
          }
          else {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"alignment",9);
            local_98.a.m_size = local_80.size;
            local_98.a.m_data = (char *)local_80.ptr;
            bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (bVar1) {
              local_98.a.m_data = *(char **)(local_50.ptr + lVar4 + 0x50);
              local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar4 + 0x58);
              QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
              setAttributeAlignment(this,(QString *)&local_80);
            }
            else {
              local_98.a.m_size = 0x15;
              local_98.a.m_data = "Unexpected attribute ";
              local_98.b = &local_68;
              QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                        ((QString *)&local_80,&local_98);
              QXmlStreamReader::raiseError((QString *)this_03);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          }
        }
      }
    }
    pQVar5 = pQVar5 + 0x68;
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_03);
      if (bVar1) goto LAB_00155a35;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_68.m_size = -0x5555555555555556;
      local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"widget",6);
      sVar3 = 0;
      other.m_data = local_80.ptr;
      other.m_size = local_80.size;
      iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (iVar2 == 0) {
        this_00 = (DomWidget *)operator_new(0x160);
        memset(this_00,0,0x160);
        DomWidget::read(this_00,__fd,__buf_00,sVar3);
        setElementWidget(this,this_00);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"layout",6);
        sVar3 = 0;
        other_00.m_data = local_80.ptr;
        other_00.m_size = local_80.size;
        iVar2 = QStringView::compare(&local_68,other_00,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        if (iVar2 == 0) {
          this_01 = (DomLayout *)operator_new(0x128);
          memset(this_01,0,0x128);
          DomLayout::DomLayout(this_01);
          DomLayout::read(this_01,__fd,__buf_01,sVar3);
          setElementLayout(this,this_01);
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"spacer",6);
          sVar3 = 0;
          other_01.m_data = local_80.ptr;
          other_01.m_size = local_80.size;
          iVar2 = QStringView::compare(&local_68,other_01,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          if (iVar2 == 0) {
            this_02 = (DomSpacer *)operator_new(0x38);
            (this_02->m_attr_name).d.d = (Data *)0x0;
            (this_02->m_attr_name).d.ptr = (char16_t *)0x0;
            (this_02->m_attr_name).d.size = 0;
            this_02->m_has_attr_name = false;
            *(undefined3 *)&this_02->field_0x19 = 0;
            this_02->m_children = 0;
            (this_02->m_property).d.d = (Data *)0x0;
            (this_02->m_property).d.ptr = (DomProperty **)0x0;
            (this_02->m_property).d.size = 0;
            DomSpacer::read(this_02,__fd,__buf_02,sVar3);
            setElementSpacer(this,this_02);
          }
          else {
            local_98.a.m_size = 0x13;
            local_98.a.m_data = "Unexpected element ";
            local_98.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      ((QString *)&local_80,&local_98);
            QXmlStreamReader::raiseError((QString *)this_03);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          }
        }
      }
    }
  } while (iVar2 != 5);
LAB_00155a35:
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutItem::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"row"_s) {
            setAttributeRow(attribute.value().toInt());
            continue;
        }
        if (name == u"column"_s) {
            setAttributeColumn(attribute.value().toInt());
            continue;
        }
        if (name == u"rowspan"_s) {
            setAttributeRowSpan(attribute.value().toInt());
            continue;
        }
        if (name == u"colspan"_s) {
            setAttributeColSpan(attribute.value().toInt());
            continue;
        }
        if (name == u"alignment"_s) {
            setAttributeAlignment(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                setElementWidget(v);
                continue;
            }
            if (!tag.compare(u"layout"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayout();
                v->read(reader);
                setElementLayout(v);
                continue;
            }
            if (!tag.compare(u"spacer"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSpacer();
                v->read(reader);
                setElementSpacer(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}